

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_rawseti(lua_State *L,int idx,lua_Integer n)

{
  Table *t_00;
  Table *t;
  lua_Integer n_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  luaH_setint(L,t_00,n,(TValue *)((L->top).offset + -0x10));
  if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) && ((t_00->marked & 0x20) != 0)) &&
     ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t_00);
  }
  (L->top).p = (StkId)((L->top).offset + -0x10);
  return;
}

Assistant:

LUA_API void lua_rawseti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lua_lock(L);
  api_checknelems(L, 1);
  t = gettable(L, idx);
  luaH_setint(L, t, n, s2v(L->top.p - 1));
  luaC_barrierback(L, obj2gco(t), s2v(L->top.p - 1));
  L->top.p--;
  lua_unlock(L);
}